

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  pointer pnVar1;
  int iVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar10;
  int iVar11;
  pointer pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  byte bVar17;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  ulong uVar9;
  ulong uVar12;
  
  bVar17 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  iVar11 = (w->super_IdxSet).num;
  if (0 < iVar11 && 0 < *(int *)(this + 8)) {
    uVar10 = iVar11 - 1;
    uVar12 = (ulong)uVar10;
    uVar7 = *(int *)(this + 8) - 1;
    uVar9 = (ulong)uVar7;
    lVar4 = *(long *)(this + 0x10);
    iVar2 = *(int *)(lVar4 + uVar9 * 4);
    piVar5 = (w->super_IdxSet).idx;
    iVar11 = piVar5[uVar12];
    if (uVar10 != 0 && uVar7 != 0) {
      do {
        iVar8 = (int)uVar9;
        if (iVar2 == iVar11) {
          lVar6 = (long)iVar11;
          pcVar3 = (cpp_dec_float<200U,_int,_void> *)(*(long *)(this + 0x20) + lVar6 * 0x80);
          pnVar1 = (w->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar13 = pnVar1 + lVar6;
          pcVar14 = &local_b0;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4);
          }
          local_b0.exp = pnVar1[lVar6].m_backend.exp;
          local_b0.neg = pnVar1[lVar6].m_backend.neg;
          local_b0.fpclass = pnVar1[lVar6].m_backend.fpclass;
          local_b0.prec_elem = pnVar1[lVar6].m_backend.prec_elem;
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 0x1c;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems[8] = 0;
          local_1b8.data._M_elems[9] = 0;
          local_1b8.data._M_elems[10] = 0;
          local_1b8.data._M_elems[0xb] = 0;
          local_1b8.data._M_elems[0xc] = 0;
          local_1b8.data._M_elems[0xd] = 0;
          local_1b8.data._M_elems[0xe] = 0;
          local_1b8.data._M_elems[0xf] = 0;
          local_1b8.data._M_elems[0x10] = 0;
          local_1b8.data._M_elems[0x11] = 0;
          local_1b8.data._M_elems[0x12] = 0;
          local_1b8.data._M_elems[0x13] = 0;
          local_1b8.data._M_elems[0x14] = 0;
          local_1b8.data._M_elems[0x15] = 0;
          local_1b8.data._M_elems[0x16] = 0;
          local_1b8.data._M_elems[0x17] = 0;
          local_1b8.data._M_elems[0x18] = 0;
          local_1b8.data._M_elems[0x19] = 0;
          local_1b8.data._M_elems._104_5_ = 0;
          local_1b8.data._M_elems[0x1b]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          if (&local_1b8 != pcVar3) {
            pcVar14 = pcVar3;
            pcVar15 = &local_1b8;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
            }
            local_1b8.exp = pcVar3->exp;
            local_1b8.neg = pcVar3->neg;
            local_1b8.fpclass = pcVar3->fpclass;
            local_1b8.prec_elem = pcVar3->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1b8,&local_b0);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_138,&local_1b8);
          lVar4 = *(long *)(this + 0x10);
          uVar9 = (ulong)(iVar8 - 1);
          iVar2 = *(int *)(lVar4 + -4 + (long)iVar8 * 4);
          piVar5 = (w->super_IdxSet).idx;
LAB_00591f2b:
          iVar11 = (int)uVar12;
          uVar12 = (ulong)(iVar11 - 1);
          iVar11 = piVar5[(long)iVar11 + -1];
        }
        else {
          if (iVar2 <= iVar11) goto LAB_00591f2b;
          uVar9 = (ulong)(iVar8 - 1);
          iVar2 = *(int *)(lVar4 + -4 + (long)iVar8 * 4);
        }
        uVar10 = (uint)uVar12;
        uVar7 = (uint)uVar9;
      } while ((uVar7 != 0) && (uVar10 != 0));
    }
    if ((uVar7 != 0) && (iVar2 != iVar11)) {
      lVar6 = (long)(int)uVar7;
      do {
        lVar6 = lVar6 + -1;
        iVar2 = *(int *)(lVar4 + lVar6 * 4);
        if (lVar6 == 0) break;
      } while (iVar2 != iVar11);
    }
    if ((uVar10 != 0) && (iVar2 != iVar11)) {
      lVar4 = (long)(int)uVar10;
      do {
        lVar4 = lVar4 + -1;
        iVar11 = piVar5[lVar4];
        if (lVar4 == 0) break;
      } while (iVar2 != iVar11);
    }
    if (iVar2 == iVar11) {
      lVar6 = (long)iVar2;
      pcVar3 = (cpp_dec_float<200U,_int,_void> *)(*(long *)(this + 0x20) + lVar6 * 0x80);
      pnVar1 = (w->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = pnVar1 + lVar6;
      pcVar14 = &local_b0;
      for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      local_b0.exp = pnVar1[lVar6].m_backend.exp;
      local_b0.neg = pnVar1[lVar6].m_backend.neg;
      local_b0.fpclass = pnVar1[lVar6].m_backend.fpclass;
      local_b0.prec_elem = pnVar1[lVar6].m_backend.prec_elem;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      if (&local_1b8 != pcVar3) {
        pcVar14 = pcVar3;
        pcVar15 = &local_1b8;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar17 * -8 + 4);
        }
        local_1b8.exp = pcVar3->exp;
        local_1b8.neg = pcVar3->neg;
        local_1b8.fpclass = pcVar3->fpclass;
        local_1b8.prec_elem = pcVar3->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b8,&local_b0);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_138,&local_1b8);
    }
  }
  pcVar14 = &local_138;
  pnVar16 = __return_storage_ptr__;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar17 * -2 + 1) * 4);
    pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar16 + ((ulong)bVar17 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = local_138.exp;
  (__return_storage_ptr__->m_backend).neg = local_138.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_138.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_138.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }